

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

char * nullcGetResult(void)

{
  char *pcVar1;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return "";
  }
  if (NULLC::currExec != 0) {
    if (NULLC::currExec == 1) {
      pcVar1 = ExecutorX86::GetResult(NULLC::executorX86);
      return pcVar1;
    }
    return "unknown executor";
  }
  pcVar1 = ExecutorRegVm::GetResult(NULLC::executorRegVm);
  return pcVar1;
}

Assistant:

const char* nullcGetResult()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED("");

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResult();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResult();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResult();
#endif

	return "unknown executor";
}